

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O2

void Cmd_playersounds(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined8 uVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  char *reserveNames [256];
  undefined8 local_838 [257];
  
  memset(local_838,0,0x800);
  puVar2 = &(S_sfx.Array)->link;
  iVar5 = 0;
  for (uVar3 = 0; (iVar5 < NumPlayerReserves && (uVar3 < S_sfx.Count)); uVar3 = uVar3 + 1) {
    if ((puVar2[-2] & 2) != 0) {
      iVar5 = iVar5 + 1;
      local_838[*puVar2] = ((FString *)(puVar2 + -10))->Chars;
    }
    puVar2 = puVar2 + 0x14;
  }
  for (uVar3 = 0; uVar3 < PlayerClassLookups.Count; uVar3 = uVar3 + 1) {
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      uVar4 = (ulong)PlayerClassLookups.Array[uVar3].ListIndex[lVar6];
      if (uVar4 != 0xffff) {
        Printf("\n%s, %s:\n",PlayerClassLookups.Array[uVar3].Name.Chars,GenderNames[lVar6]);
        for (lVar7 = 0; lVar7 < NumPlayerReserves; lVar7 = lVar7 + 1) {
          uVar1 = local_838[lVar7];
          iVar5 = FPlayerSoundHashTable::LookupSound(PlayerSounds.Array + uVar4,(int)lVar7);
          Printf(" %-16s%s\n",uVar1,S_sfx.Array[iVar5].name.Chars);
        }
      }
    }
  }
  return;
}

Assistant:

CCMD (playersounds)
{
	const char *reserveNames[256];
	unsigned int i;
	int j, k, l;

	// Find names for the player sounds
	memset (reserveNames, 0, sizeof(reserveNames));
	for (i = j = 0; j < NumPlayerReserves && i < S_sfx.Size(); ++i)
	{
		if (S_sfx[i].bPlayerReserve)
		{
			++j;
			reserveNames[S_sfx[i].link] = S_sfx[i].name;
		}
	}

	for (i = 0; i < PlayerClassLookups.Size(); ++i)
	{
		for (j = 0; j < 3; ++j)
		{
			if ((l = PlayerClassLookups[i].ListIndex[j]) != 0xffff)
			{
				Printf ("\n%s, %s:\n", PlayerClassLookups[i].Name.GetChars(), GenderNames[j]);
				for (k = 0; k < NumPlayerReserves; ++k)
				{
					Printf (" %-16s%s\n", reserveNames[k], S_sfx[PlayerSounds[l].LookupSound (k)].name.GetChars());
				}
			}
		}
	}
}